

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::addImpl
          (DoubleAPFloat *this,APFloat *a,APFloat *aa,APFloat *c,APFloat *cc,roundingMode RM)

{
  Storage *pSVar1;
  opStatus oVar2;
  opStatus oVar3;
  opStatus oVar4;
  opStatus oVar5;
  opStatus oVar6;
  opStatus oVar7;
  opStatus oVar8;
  opStatus oVar9;
  cmpResult cVar10;
  opStatus oVar11;
  Storage *pSVar12;
  APFloat *pAVar13;
  undefined8 uVar14;
  APFloat *pAVar15;
  APFloat z;
  APFloat q;
  APFloat zz;
  undefined1 local_90 [8];
  Storage local_88;
  undefined1 local_70 [8];
  Storage local_68;
  undefined1 local_50 [8];
  Storage local_48;
  
  pSVar1 = &a->U;
  APFloat::Storage::Storage((Storage *)(local_90 + 8),pSVar1);
  oVar2 = APFloat::add((APFloat *)local_90,c,RM);
  uVar14 = local_90;
  if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
    uVar14 = local_88.IEEE.significand;
  }
  if ((*(byte *)(uVar14 + 0x1a) & 6) == 0) {
    if ((*(byte *)(uVar14 + 0x1a) & 1) != 0) {
      APFloat::Storage::operator=
                ((Storage *)
                 &(((this->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                 (Storage *)(local_90 + 8));
      pAVar13 = (this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
LAB_0017e1e6:
      APFloat::makeZero(pAVar13 + 1,false);
      goto LAB_0017e1f1;
    }
    cVar10 = APFloat::compareAbsoluteValue(a,c);
    APFloat::Storage::operator=((Storage *)(local_90 + 8),&cc->U);
    oVar2 = APFloat::add((APFloat *)local_90,aa,RM);
    pAVar15 = c;
    pAVar13 = a;
    if (cVar10 == cmpGreaterThan) {
      pAVar15 = a;
      pAVar13 = c;
    }
    oVar3 = APFloat::add((APFloat *)local_90,pAVar13,RM);
    oVar4 = APFloat::add((APFloat *)local_90,pAVar15,RM);
    uVar14 = local_90;
    if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
      uVar14 = local_88.IEEE.significand;
    }
    oVar2 = oVar4 | oVar3 | oVar2;
    pSVar12 = &((this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U;
    if ((*(byte *)(uVar14 + 0x1a) & 6) == 0) {
      APFloat::Storage::operator=((Storage *)&pSVar12->IEEE,(Storage *)(local_90 + 8));
      pAVar13 = (this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      goto LAB_0017e1e6;
    }
    APFloat::Storage::operator=((Storage *)&pSVar12->IEEE,(Storage *)(local_90 + 8));
    APFloat::Storage::Storage((Storage *)(local_70 + 8),&aa->U);
    oVar3 = APFloat::add((APFloat *)local_70,cc,RM);
    pSVar12 = &c->U;
    if (cVar10 == cmpGreaterThan) {
      a = c;
      pSVar12 = pSVar1;
    }
    APFloat::Storage::operator=
              ((Storage *)
               &(this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,pSVar12);
    oVar4 = APFloat::subtract((this->Floats)._M_t.
                              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                              .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                              (APFloat *)local_90,RM);
    oVar5 = APFloat::add((this->Floats)._M_t.
                         super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                         .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,a,RM);
    oVar6 = APFloat::add((this->Floats)._M_t.
                         super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                         .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                         (APFloat *)local_70,RM);
    oVar2 = oVar2 | oVar6 | oVar3 | oVar5 | oVar4;
  }
  else {
    APFloat::Storage::Storage((Storage *)&((Storage *)(local_70 + 8))->IEEE,pSVar1);
    oVar3 = APFloat::subtract((APFloat *)local_70,(APFloat *)local_90,RM);
    APFloat::Storage::Storage((Storage *)(local_50 + 8),(Storage *)(local_70 + 8));
    oVar4 = APFloat::add((APFloat *)local_50,c,RM);
    oVar5 = APFloat::add((APFloat *)local_70,(APFloat *)local_90,RM);
    oVar6 = APFloat::subtract((APFloat *)local_70,a,RM);
    APFloat::changeSign((APFloat *)local_70);
    oVar7 = APFloat::add((APFloat *)local_50,(APFloat *)local_70,RM);
    oVar8 = APFloat::add((APFloat *)local_50,aa,RM);
    oVar9 = APFloat::add((APFloat *)local_50,cc,RM);
    uVar14 = local_50;
    if (local_48.semantics == (fltSemantics *)semPPCDoubleDouble) {
      uVar14 = local_48.IEEE.significand;
    }
    pSVar12 = &((this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U;
    pSVar1 = (Storage *)(local_90 + 8);
    if ((*(byte *)(uVar14 + 0x1a) & 0xf) == 3) {
      APFloat::Storage::operator=((Storage *)&pSVar12->IEEE,pSVar1);
      pAVar15 = (this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      oVar2 = opOK;
LAB_0017e1b0:
      APFloat::makeZero(pAVar15 + 1,false);
    }
    else {
      APFloat::Storage::operator=((Storage *)&pSVar12->IEEE,pSVar1);
      oVar11 = APFloat::add((this->Floats)._M_t.
                            super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                            .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                            (APFloat *)local_50,RM);
      oVar2 = oVar7 | oVar8 | oVar9 | oVar5 | oVar6 | oVar3 | oVar4 | oVar2 | oVar11;
      pAVar15 = (this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      pAVar13 = (APFloat *)(pAVar15->U).IEEE.significand.part;
      if ((pAVar15->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
        pAVar13 = pAVar15;
      }
      if ((*(undefined1 *)((long)&pAVar13->U + 0x12) & 6) == 0) goto LAB_0017e1b0;
      APFloat::Storage::operator=((Storage *)&pAVar15[1].U.IEEE,pSVar1);
      pAVar13 = (this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      oVar3 = APFloat::subtract(pAVar13 + 1,pAVar13,RM);
      oVar4 = APFloat::add((this->Floats)._M_t.
                           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                           .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                           (APFloat *)local_50,RM);
      oVar2 = oVar2 | oVar4 | oVar3;
    }
    APFloat::Storage::~Storage((Storage *)(local_50 + 8));
  }
  APFloat::Storage::~Storage((Storage *)(local_70 + 8));
LAB_0017e1f1:
  APFloat::Storage::~Storage((Storage *)(local_90 + 8));
  return oVar2;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addImpl(const APFloat &a, const APFloat &aa,
                                         const APFloat &c, const APFloat &cc,
                                         roundingMode RM) {
  int Status = opOK;
  APFloat z = a;
  Status |= z.add(c, RM);
  if (!z.isFinite()) {
    if (!z.isInfinity()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Status = opOK;
    auto AComparedToC = a.compareAbsoluteValue(c);
    z = cc;
    Status |= z.add(aa, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // z = cc + aa + c + a;
      Status |= z.add(c, RM);
      Status |= z.add(a, RM);
    } else {
      // z = cc + aa + a + c;
      Status |= z.add(a, RM);
      Status |= z.add(c, RM);
    }
    if (!z.isFinite()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[0] = z;
    APFloat zz = aa;
    Status |= zz.add(cc, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // Floats[1] = a - z + c + zz;
      Floats[1] = a;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(c, RM);
      Status |= Floats[1].add(zz, RM);
    } else {
      // Floats[1] = c - z + a + zz;
      Floats[1] = c;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(a, RM);
      Status |= Floats[1].add(zz, RM);
    }
  } else {
    // q = a - z;
    APFloat q = a;
    Status |= q.subtract(z, RM);

    // zz = q + c + (a - (q + z)) + aa + cc;
    // Compute a - (q + z) as -((q + z) - a) to avoid temporary copies.
    auto zz = q;
    Status |= zz.add(c, RM);
    Status |= q.add(z, RM);
    Status |= q.subtract(a, RM);
    q.changeSign();
    Status |= zz.add(q, RM);
    Status |= zz.add(aa, RM);
    Status |= zz.add(cc, RM);
    if (zz.isZero() && !zz.isNegative()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return opOK;
    }
    Floats[0] = z;
    Status |= Floats[0].add(zz, RM);
    if (!Floats[0].isFinite()) {
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[1] = std::move(z);
    Status |= Floats[1].subtract(Floats[0], RM);
    Status |= Floats[1].add(zz, RM);
  }
  return (opStatus)Status;
}